

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginComboPreview(void)

{
  ImGuiComboPreviewData *clip_rect_min;
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  float fVar5;
  float fVar6;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->SkipItems == false) && (((GImGui->LastItemData).StatusFlags & 0x200) != 0)) {
    clip_rect_min = &GImGui->ComboPreviewData;
    fVar5 = (clip_rect_min->PreviewRect).Min.x;
    if (((pIVar2->ClipRect).Min.x <= fVar5) &&
       ((((pIVar2->ClipRect).Min.y <= (GImGui->ComboPreviewData).PreviewRect.Min.y &&
         ((GImGui->ComboPreviewData).PreviewRect.Max.x <= (pIVar2->ClipRect).Max.x)) &&
        ((GImGui->ComboPreviewData).PreviewRect.Max.y <= (pIVar2->ClipRect).Max.y)))) {
      (GImGui->ComboPreviewData).BackupCursorPos = (pIVar2->DC).CursorPos;
      (pIVar4->ComboPreviewData).BackupCursorMaxPos = (pIVar2->DC).CursorMaxPos;
      (pIVar4->ComboPreviewData).BackupCursorPosPrevLine = (pIVar2->DC).CursorPosPrevLine;
      (pIVar4->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar4->ComboPreviewData).BackupLayout = (pIVar2->DC).LayoutType;
      IVar1 = (pIVar4->Style).FramePadding;
      fVar5 = fVar5 + IVar1.x;
      fVar6 = (pIVar4->ComboPreviewData).PreviewRect.Min.y + IVar1.y;
      IVar1.y = fVar6;
      IVar1.x = fVar5;
      (pIVar2->DC).CursorPos = IVar1;
      IVar3.y = fVar6;
      IVar3.x = fVar5;
      (pIVar2->DC).CursorMaxPos = IVar3;
      (pIVar2->DC).LayoutType = 0;
      (pIVar2->DC).IsSameLine = false;
      PushClipRect((ImVec2 *)clip_rect_min,&(pIVar4->ComboPreviewData).PreviewRect.Max,true);
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible))
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Contains(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}